

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderCancelReplaceRequest.h
# Opt level: O1

void __thiscall
FIX50::OrderCancelReplaceRequest::OrderCancelReplaceRequest
          (OrderCancelReplaceRequest *this,OrigClOrdID *aOrigClOrdID,ClOrdID *aClOrdID,Side *aSide,
          TransactTime *aTransactTime,OrdType *aOrdType)

{
  FieldBase local_88;
  
  MsgType();
  Message::Message(&this->super_Message,(MsgType *)&local_88);
  FIX::FieldBase::~FieldBase(&local_88);
  *(undefined ***)&this->super_Message = &PTR__Message_00162528;
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aOrigClOrdID,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aClOrdID,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aSide,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aTransactTime,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aOrdType,true);
  return;
}

Assistant:

OrderCancelReplaceRequest(
      const FIX::OrigClOrdID& aOrigClOrdID,
      const FIX::ClOrdID& aClOrdID,
      const FIX::Side& aSide,
      const FIX::TransactTime& aTransactTime,
      const FIX::OrdType& aOrdType )
    : Message(MsgType())
    {
      set(aOrigClOrdID);
      set(aClOrdID);
      set(aSide);
      set(aTransactTime);
      set(aOrdType);
    }